

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

void __thiscall
pbrt::LightBounds::LightBounds
          (LightBounds *this,Bounds3f *b,Vector3f *w,Float phi,Float cosTheta_o,Float cosTheta_e,
          bool twoSided)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  undefined8 extraout_XMM0_Qb;
  Vector3<float> VVar4;
  
  fVar3 = (b->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (b->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar3;
  fVar3 = (b->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(b->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (b->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar1;
  this->phi = phi;
  VVar4 = Normalize<float>(w);
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar1 = vmovlps_avx(auVar2);
  (this->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (this->w).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  (this->w).super_Tuple3<pbrt::Vector3,_float>.z = VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
  this->cosTheta_o = cosTheta_o;
  this->cosTheta_e = cosTheta_e;
  this->twoSided = twoSided;
  return;
}

Assistant:

inline LightBounds::LightBounds(const Bounds3f &b, const Vector3f &w, Float phi,
                                Float cosTheta_o, Float cosTheta_e, bool twoSided)
    : bounds(b),
      w(Normalize(w)),
      phi(phi),
      cosTheta_o(cosTheta_o),
      cosTheta_e(cosTheta_e),
      twoSided(twoSided) {}